

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GetAsyncCommandResponse_SetupDataSource::Serialize
          (GetAsyncCommandResponse_SetupDataSource *this,Message *msg)

{
  bool bVar1;
  DataSourceConfig *this_00;
  Message *msg_00;
  void *data;
  size_t size;
  Message *msg_local;
  GetAsyncCommandResponse_SetupDataSource *this_local;
  
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,1,this->new_instance_id_);
  }
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    this_00 = protozero::CopyablePtr<perfetto::protos::gen::DataSourceConfig>::operator*
                        (&this->config_);
    msg_00 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,2);
    DataSourceConfig::Serialize(this_00,msg_00);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void GetAsyncCommandResponse_SetupDataSource::Serialize(::protozero::Message* msg) const {
  // Field 1: new_instance_id
  if (_has_field_[1]) {
    msg->AppendVarInt(1, new_instance_id_);
  }

  // Field 2: config
  if (_has_field_[2]) {
    (*config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}